

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg,string *config,
          string *lang,cmCompiledGeneratorExpression *inputExpression,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputFiles,mode_t perm)

{
  bool bVar1;
  __type _Var2;
  pointer pcVar3;
  string *psVar4;
  ulong uVar5;
  pointer ppVar6;
  ostream *poVar7;
  cmMakefile *this_00;
  mapped_type *this_01;
  char *file;
  undefined1 local_678 [8];
  cmGeneratedFileStream fout;
  undefined1 local_410 [8];
  ostringstream e_1;
  _Self local_298;
  _Self local_290;
  iterator it;
  string local_268;
  string *local_248;
  string *outputContent;
  string outputFileName;
  undefined1 local_200 [8];
  ostringstream e;
  undefined1 local_78 [8];
  string condResult;
  string rawCondition;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *outputFiles_local;
  cmCompiledGeneratorExpression *inputExpression_local;
  string *lang_local;
  string *config_local;
  cmLocalGenerator *lg_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  pcVar3 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->(&this->Condition);
  psVar4 = cmCompiledGeneratorExpression::GetInput_abi_cxx11_(pcVar3);
  std::__cxx11::string::string((string *)(condResult.field_2._M_local_buf + 8),(string *)psVar4);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    pcVar3 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->(&this->Condition);
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,lang);
    std::__cxx11::string::string((string *)local_78,(string *)psVar4);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_78,"0");
    if (bVar1) {
      bVar1 = true;
    }
    else {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_78,"1");
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
        poVar7 = std::operator<<((ostream *)local_200,"Evaluation file condition \"");
        poVar7 = std::operator<<(poVar7,(string *)(condResult.field_2._M_local_buf + 8));
        poVar7 = std::operator<<(poVar7,"\" did not evaluate to valid content. Got \"");
        poVar7 = std::operator<<(poVar7,(string *)local_78);
        std::operator<<(poVar7,"\".");
        std::__cxx11::ostringstream::str();
        cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)((long)&outputFileName.field_2 + 8))
        ;
        std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
        bVar1 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
      }
      else {
        bVar1 = false;
      }
    }
    std::__cxx11::string::~string((string *)local_78);
    if (bVar1) goto LAB_0054756c;
  }
  pcVar3 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->(&this->OutputFileExpr);
  psVar4 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar3,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,lang);
  std::__cxx11::string::string((string *)&outputContent,(string *)psVar4);
  local_248 = cmCompiledGeneratorExpression::Evaluate
                        (inputExpression,lg,config,false,(cmGeneratorTarget *)0x0,
                         (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,lang);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)&outputContent);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_268,(string *)&outputContent);
    std::__cxx11::string::operator=((string *)&outputContent,(string *)&local_268);
    std::__cxx11::string::~string((string *)&local_268);
  }
  else {
    FixRelativePath((string *)&it,this,(string *)&outputContent,PathForOutput,lg);
    std::__cxx11::string::operator=((string *)&outputContent,(string *)&it);
    std::__cxx11::string::~string((string *)&it);
  }
  local_290._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(outputFiles,(key_type *)&outputContent);
  local_298._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(outputFiles);
  bVar1 = std::operator!=(&local_290,&local_298);
  if (bVar1) {
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_290);
    _Var2 = std::operator==(&ppVar6->second,local_248);
    if (!_Var2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      poVar7 = std::operator<<((ostream *)local_410,
                               "Evaluation file to be written multiple times with different content. This is generally caused by the content evaluating the configuration type, language, or location of object files:\n "
                              );
      std::operator<<(poVar7,(string *)&outputContent);
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,(string *)&fout.field_0x240);
      std::__cxx11::string::~string((string *)&fout.field_0x240);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
    }
  }
  else {
    this_00 = cmLocalGenerator::GetMakefile(lg);
    cmMakefile::AddCMakeOutputFile(this_00,(string *)&outputContent);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Files,(value_type *)&outputContent);
    psVar4 = local_248;
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](outputFiles,(key_type *)&outputContent);
    std::__cxx11::string::operator=((string *)this_01,(string *)psVar4);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_678,(string *)&outputContent,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_678,true);
    std::operator<<((ostream *)local_678,(string *)local_248);
    bVar1 = cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_678);
    if ((bVar1) && (perm != 0)) {
      file = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::SetPermissions(file,perm,false);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_678);
  }
  std::__cxx11::string::~string((string *)&outputContent);
LAB_0054756c:
  std::__cxx11::string::~string((string *)(condResult.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(
  cmLocalGenerator* lg, const std::string& config, const std::string& lang,
  cmCompiledGeneratorExpression* inputExpression,
  std::map<std::string, std::string>& outputFiles, mode_t perm)
{
  std::string rawCondition = this->Condition->GetInput();
  if (!rawCondition.empty()) {
    std::string condResult = this->Condition->Evaluate(
      lg, config, false, nullptr, nullptr, nullptr, lang);
    if (condResult == "0") {
      return;
    }
    if (condResult != "1") {
      std::ostringstream e;
      e << "Evaluation file condition \"" << rawCondition
        << "\" did "
           "not evaluate to valid content. Got \""
        << condResult << "\".";
      lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  std::string outputFileName = this->OutputFileExpr->Evaluate(
    lg, config, false, nullptr, nullptr, nullptr, lang);
  const std::string& outputContent = inputExpression->Evaluate(
    lg, config, false, nullptr, nullptr, nullptr, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  std::map<std::string, std::string>::iterator it =
    outputFiles.find(outputFileName);

  if (it != outputFiles.end()) {
    if (it->second == outputContent) {
      return;
    }
    std::ostringstream e;
    e << "Evaluation file to be written multiple times with different "
         "content. "
         "This is generally caused by the content evaluating the "
         "configuration type, language, or location of object files:\n "
      << outputFileName;
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  lg->GetMakefile()->AddCMakeOutputFile(outputFileName);
  this->Files.push_back(outputFileName);
  outputFiles[outputFileName] = outputContent;

  cmGeneratedFileStream fout(outputFileName);
  fout.SetCopyIfDifferent(true);
  fout << outputContent;
  if (fout.Close() && perm) {
    cmSystemTools::SetPermissions(outputFileName.c_str(), perm);
  }
}